

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

t_int * vsnapshot_tilde_perform(t_int *w)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  int local_30;
  int i;
  int n;
  t_sample *out;
  t_vsnapshot *x;
  t_sample *in;
  t_int *w_local;
  
  lVar2 = w[1];
  lVar3 = w[2];
  lVar4 = *(long *)(lVar3 + 0x38);
  iVar1 = *(int *)(lVar3 + 0x30);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    *(undefined4 *)(lVar4 + (long)local_30 * 4) = *(undefined4 *)(lVar2 + (long)local_30 * 4);
  }
  dVar5 = clock_getlogicaltime();
  *(double *)(lVar3 + 0x48) = dVar5;
  *(undefined4 *)(lVar3 + 0x34) = 1;
  return w + 3;
}

Assistant:

static t_int *vsnapshot_tilde_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_vsnapshot *x = (t_vsnapshot *)(w[2]);
    t_sample *out = x->x_vec;
    int n = x->x_n, i;
    for (i = 0; i < n; i++)
        out[i] = in[i];
    x->x_time = clock_getlogicaltime();
    x->x_gotone = 1;
    return (w+3);
}